

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_CharArg_Test::TestBody(ArgTest_CharArg_Test *this)

{
  StrictMock<mock_visitor<wchar_t>_> *pSVar1;
  StrictMock<mock_visitor<wchar_t>_> visitor_2;
  StrictMock<mock_visitor<wchar_t>_> visitor_1;
  StrictMock<mock_visitor<char>_> visitor;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_fffffffffffffc88;
  StrictMock<mock_visitor<char>_> *in_stack_fffffffffffffc90;
  StrictMock<mock_visitor<char>_> *in_stack_fffffffffffffcb0;
  wchar_t value;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  char *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  MockSpec<test_result_(char)> *in_stack_fffffffffffffda0;
  undefined1 local_c8 [200];
  
  testing::StrictMock<mock_visitor<char>_>::StrictMock(in_stack_fffffffffffffcb0);
  value = (wchar_t)((ulong)local_c8 >> 0x20);
  testing::Matcher<char>::Matcher
            ((Matcher<char> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (char)((ulong)local_c8 >> 0x38));
  pSVar1 = (StrictMock<mock_visitor<wchar_t>_> *)
           mock_visitor<char>::gmock_visit
                     ((mock_visitor<char> *)in_stack_fffffffffffffc90,
                      (Matcher<char> *)in_stack_fffffffffffffc88);
  testing::internal::MockSpec<test_result_(char)>::InternalExpectedAt
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  testing::Matcher<char>::~Matcher((Matcher<char> *)0x1211b9);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
            ((char *)in_stack_fffffffffffffc90);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<char>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffffc90,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffffc88);
  testing::StrictMock<mock_visitor<char>_>::~StrictMock(in_stack_fffffffffffffc90);
  testing::StrictMock<mock_visitor<wchar_t>_>::StrictMock(pSVar1);
  testing::Matcher<wchar_t>::Matcher
            ((Matcher<wchar_t> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),value
            );
  mock_visitor<wchar_t>::gmock_visit
            ((mock_visitor<wchar_t> *)in_stack_fffffffffffffc90,
             (Matcher<wchar_t> *)in_stack_fffffffffffffc88);
  testing::internal::MockSpec<test_result_(wchar_t)>::InternalExpectedAt
            ((MockSpec<test_result_(wchar_t)> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             in_stack_fffffffffffffd94,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  testing::Matcher<wchar_t>::~Matcher((Matcher<wchar_t> *)0x121276);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,char>
            ((char *)in_stack_fffffffffffffc90);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<wchar_t>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<wchar_t>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  testing::StrictMock<mock_visitor<wchar_t>_>::~StrictMock
            ((StrictMock<mock_visitor<wchar_t>_> *)in_stack_fffffffffffffc90);
  testing::StrictMock<mock_visitor<wchar_t>_>::StrictMock(pSVar1);
  testing::Matcher<wchar_t>::Matcher
            ((Matcher<wchar_t> *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),value
            );
  pSVar1 = (StrictMock<mock_visitor<wchar_t>_> *)
           mock_visitor<wchar_t>::gmock_visit
                     ((mock_visitor<wchar_t> *)in_stack_fffffffffffffc90,
                      (Matcher<wchar_t> *)in_stack_fffffffffffffc88);
  testing::internal::MockSpec<test_result_(wchar_t)>::InternalExpectedAt
            ((MockSpec<test_result_(wchar_t)> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             in_stack_fffffffffffffd94,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  testing::Matcher<wchar_t>::~Matcher((Matcher<wchar_t> *)0x12132a);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t>
            ((wchar_t *)pSVar1);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<wchar_t>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (pSVar1,in_stack_fffffffffffffc88);
  testing::StrictMock<mock_visitor<wchar_t>_>::~StrictMock(pSVar1);
  return;
}

Assistant:

TEST(ArgTest, CharArg) {
  CHECK_ARG_(char, 'a', 'a');
  CHECK_ARG_(wchar_t, L'a', 'a');
  CHECK_ARG_(wchar_t, L'a', L'a');
}